

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_database.cpp
# Opt level: O1

bool __thiscall
fineftp::UserDatabase::addUser
          (UserDatabase *this,string *username,string *password,string *param_3,
          Permission permissions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  iterator iVar6;
  FtpUser *pFVar7;
  undefined8 uVar8;
  UserDatabase *this_01;
  shared_ptr<fineftp::FtpUser> local_48;
  
  this_01 = this;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 == 0) {
    bVar3 = isUsernameAnonymousUser(this_01,username);
    if (bVar3) {
      if ((this->anonymous_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0) {
        pFVar7 = (FtpUser *)operator_new(0x48);
        FtpUser::FtpUser(pFVar7,password,param_3,permissions);
        local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar7;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fineftp::FtpUser*>
                  (&local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,pFVar7);
        _Var2._M_pi = local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        peVar1 = local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (FtpUser *)0x0;
        local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
             = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (this->anonymous_user_).
                  super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        (this->anonymous_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar1;
        (this->anonymous_user_).super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var2._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&::std::cout,"Successfully added anonymous user.",0x22);
        ::std::ios::widen((char)*(undefined8 *)(::std::cout + -0x18) + '@');
        ::std::ostream::put('@');
        bVar3 = true;
        ::std::ostream::flush();
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&::std::cerr,"Error adding user with username \"",0x21);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&::std::cerr,(username->_M_dataplus)._M_p,
                            username->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\". The username denotes the anonymous user, which is already present.",
                   0x45);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        ::std::ostream::put((char)poVar5);
        ::std::ostream::flush();
        bVar3 = false;
      }
    }
    else {
      iVar6 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<fineftp::FtpUser>_>_>_>
              ::find(&(this->database_)._M_t,username);
      bVar3 = (_Rb_tree_header *)iVar6._M_node ==
              &(this->database_)._M_t._M_impl.super__Rb_tree_header;
      if (bVar3) {
        pFVar7 = (FtpUser *)operator_new(0x48);
        FtpUser::FtpUser(pFVar7,password,param_3,permissions);
        local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pFVar7;
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fineftp::FtpUser*>
                  (&local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,pFVar7);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<fineftp::FtpUser>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<fineftp::FtpUser>>>>
                    *)&this->database_,username,&local_48);
        if (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&::std::cout,"Successfully added user \"",0x19);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&::std::cout,(username->_M_dataplus)._M_p,
                            username->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
      else {
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&::std::cerr,"Error adding user with username \"",0x21);
        poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&::std::cerr,(username->_M_dataplus)._M_p,
                            username->_M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"\". The user already exists.",0x1b);
        ::std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      }
      ::std::ostream::put((char)poVar5);
      ::std::ostream::flush();
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return bVar3;
  }
  uVar8 = ::std::__throw_system_error(iVar4);
  if (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<fineftp::FtpUser,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar8);
}

Assistant:

bool UserDatabase::addUser(const std::string& username, const std::string& password, const std::string& local_root_path, Permission permissions)
  {
    std::lock_guard<decltype(database_mutex_)> database_lock(database_mutex_);

    if (isUsernameAnonymousUser(username))
    {
      if (anonymous_user_)
      {
        std::cerr << "Error adding user with username \"" << username << "\". The username denotes the anonymous user, which is already present." << std::endl;
        return false;
      }
      else
      {
        anonymous_user_ = std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions));
#ifndef NDEBUG
        std::cout << "Successfully added anonymous user." << std::endl;
#endif // !NDEBUG
        return true;
      }
    }
    else
    {
      auto user_it = database_.find(username);
      if (user_it == database_.end())
      {
        database_.emplace(username, std::shared_ptr<FtpUser>(new FtpUser(password, local_root_path, permissions)));
#ifndef NDEBUG
        std::cout << "Successfully added user \"" << username << "\"." << std::endl;
#endif // !NDEBUG
        return true;
      }
      else
      {
        std::cerr << "Error adding user with username \"" << username << "\". The user already exists." << std::endl;
        return false;
      }
    }
  }